

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O3

bool ON_Intersect(ON_BoundingBox *bbox,ON_Line *line,double tol,ON_Interval *line_parameters)

{
  ON_3dPoint *this;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  int i;
  double *pdVar1;
  int iVar2;
  bool bVar3;
  int i_00;
  int i_01;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_3dVector v;
  ON_Line chord;
  double local_138;
  double local_128;
  undefined1 local_118 [64];
  ON_3dPoint local_d8;
  ON_3dVector local_c0;
  ON_Line local_a8;
  undefined1 local_78 [24];
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  ON_Line::Direction(&local_c0,line);
  i = ON_3dVector::MaximumCoordinateIndex(&local_c0);
  dVar7 = ON_3dPoint::operator[](&line->from,i);
  dVar9 = ON_3dPoint::operator[](&line->to,i);
  dVar8 = ON_3dPoint::operator[](&bbox->m_min,i);
  this = &bbox->m_max;
  dVar10 = ON_3dPoint::operator[](this,i);
  if (dVar10 < dVar8) {
    return false;
  }
  dVar6 = (double)(-(ulong)(0.0 <= tol) & (ulong)tol);
  dVar8 = dVar8 - (dVar6 + dVar7);
  dVar10 = dVar10 + (dVar6 - dVar7);
  if (dVar10 < dVar8) {
    return false;
  }
  dVar9 = dVar9 - dVar7;
  if ((dVar9 == 0.0) && (!NAN(dVar9))) {
    if ((dVar8 <= 0.0) && (0.0 <= dVar10)) {
      return false;
    }
    if (line_parameters != (ON_Interval *)0x0) {
      ON_Interval::Set(line_parameters,0.0,0.0);
      return true;
    }
    return true;
  }
  if (ABS(dVar9) < 1.0) {
    dVar7 = ABS(dVar9) * 1e+308;
    if (dVar7 <= ABS(dVar8)) {
      return false;
    }
    if (dVar7 <= ABS(dVar10)) {
      return false;
    }
  }
  dVar8 = (1.0 / dVar9) * dVar8;
  dVar10 = (1.0 / dVar9) * dVar10;
  uVar5 = SUB84(dVar10,0);
  uVar4 = (undefined4)((ulong)dVar10 >> 0x20);
  local_118._8_4_ = uVar5;
  local_118._0_8_ = dVar8;
  local_118._12_4_ = uVar4;
  ON_Line::PointAt(&local_48,line,dVar8);
  local_78._8_4_ = uVar5;
  local_78._0_8_ = local_118._8_8_;
  local_78._12_4_ = uVar4;
  ON_Line::PointAt(&local_60,line,local_118._8_8_);
  from_pt.y = local_48.y;
  from_pt.x = local_48.x;
  from_pt.z = local_48.z;
  to_pt.y = local_60.y;
  to_pt.x = local_60.x;
  to_pt.z = local_60.z;
  ON_Line::ON_Line(&local_a8,from_pt,to_pt);
  pdVar1 = ON_3dVector::operator[](&local_c0,(i + 1) % 3);
  dVar7 = *pdVar1;
  pdVar1 = ON_3dVector::operator[](&local_c0,(i + 2) % 3);
  i_01 = (int)((i - (uint)(ABS(*pdVar1) < ABS(dVar7))) + 2) % 3;
  pdVar1 = ON_3dPoint::operator[](&local_a8.from,i_01);
  dVar7 = *pdVar1;
  pdVar1 = ON_3dPoint::operator[](&local_a8.to,i_01);
  dVar9 = *pdVar1;
  local_138 = ON_3dPoint::operator[](&bbox->m_min,i_01);
  dVar10 = ON_3dPoint::operator[](this,i_01);
  if (local_138 <= dVar10) {
    local_138 = local_138 - (dVar6 + dVar7);
    dVar10 = (dVar6 - dVar7) + dVar10;
    if (((local_138 <= dVar10) &&
        ((dVar9 = dVar9 - dVar7, local_138 <= 0.0 || (local_138 <= dVar9)))) &&
       ((0.0 <= dVar10 || (dVar9 <= dVar10)))) {
      if ((1.0 <= ABS(dVar9)) ||
         ((dVar7 = ABS(dVar9) * 1e+308, ABS(local_138) <= dVar7 && (ABS(dVar10) <= dVar7)))) {
        local_138 = local_138 * (1.0 / dVar9);
        dVar10 = (1.0 / dVar9) * dVar10;
        if (local_138 <= 1.0) {
          if ((0.0 <= local_138) || (local_138 = 0.0, 0.0 <= dVar10)) goto LAB_004b8091;
        }
        else {
          local_138 = 1.0;
          if (dVar10 <= 1.0) {
LAB_004b8091:
            local_128 = 0.0;
            if ((0.0 <= dVar10) && (local_128 = dVar10, 1.0 < dVar10)) {
              local_128 = 1.0;
            }
            ON_Line::PointAt(&local_d8,&local_a8,local_138);
            ON_3dVector::operator=(&local_c0,&local_d8);
            ON_Line::PointAt(&local_d8,&local_a8,local_128);
            local_a8.to.z = local_d8.z;
            local_a8.to.x = local_d8.x;
            local_a8.to.y = local_d8.y;
            ON_3dPoint::operator=(&local_a8.from,&local_c0);
            local_118._8_8_ = dVar8 * (1.0 - local_128) + (double)local_78._8_8_ * local_128;
            local_118._0_8_ = dVar8 * (1.0 - local_138) + (double)local_78._0_8_ * local_138;
          }
        }
      }
      iVar2 = 2 - (uint)(i_01 != 1 && i != 1);
      i_00 = 0;
      if (i_01 == 0) {
        i_00 = iVar2;
      }
      if (i == 0) {
        i_00 = iVar2;
      }
      pdVar1 = ON_3dPoint::operator[](&local_a8.from,i_00);
      dVar7 = *pdVar1;
      pdVar1 = ON_3dPoint::operator[](&local_a8.to,i_00);
      dVar9 = *pdVar1;
      dVar8 = ON_3dPoint::operator[](&bbox->m_min,i_00);
      dVar10 = ON_3dPoint::operator[](this,i_00);
      if (dVar8 <= dVar10) {
        dVar8 = dVar8 - (dVar6 + dVar7);
        dVar10 = (dVar6 - dVar7) + dVar10;
        if (((dVar8 <= dVar10) && ((dVar9 = dVar9 - dVar7, dVar8 <= 0.0 || (dVar8 <= dVar9)))) &&
           ((0.0 <= dVar10 || (dVar9 <= dVar10)))) {
          bVar3 = true;
          if (line_parameters == (ON_Interval *)0x0) goto LAB_004b823e;
          if ((1.0 <= ABS(dVar9)) ||
             ((dVar7 = ABS(dVar9) * 1e+308, ABS(dVar8) <= dVar7 && (ABS(dVar10) <= dVar7)))) {
            dVar8 = dVar8 * (1.0 / dVar9);
            dVar10 = (1.0 / dVar9) * dVar10;
            if (dVar8 <= 1.0) {
              if ((0.0 <= dVar8) || (dVar8 = 0.0, 0.0 <= dVar10)) goto LAB_004b82f0;
            }
            else {
              dVar8 = 1.0;
              if (dVar10 <= 1.0) {
LAB_004b82f0:
                dVar7 = 0.0;
                if ((0.0 <= dVar10) && (dVar7 = dVar10, 1.0 < dVar10)) {
                  dVar7 = 1.0;
                }
                dVar9 = (double)local_118._0_8_ * (1.0 - dVar7);
                local_118._0_8_ =
                     (double)local_118._0_8_ * (1.0 - dVar8) + (double)local_118._8_8_ * dVar8;
                local_118._8_8_ = dVar9 + (double)local_118._8_8_ * dVar7;
              }
            }
          }
          uVar4 = (undefined4)local_118._8_8_;
          uVar5 = (undefined4)((ulong)local_118._8_8_ >> 0x20);
          if ((double)local_118._0_8_ <= (double)local_118._8_8_) {
            uVar4 = (undefined4)local_118._0_8_;
            uVar5 = (undefined4)((ulong)local_118._0_8_ >> 0x20);
            local_118._0_8_ = local_118._8_8_;
          }
          ON_Interval::Set(line_parameters,(double)CONCAT44(uVar5,uVar4),(double)local_118._0_8_);
          goto LAB_004b823e;
        }
      }
    }
  }
  bVar3 = false;
LAB_004b823e:
  ON_Line::~ON_Line(&local_a8);
  return bVar3;
}

Assistant:

bool ON_Intersect( const ON_BoundingBox& bbox, 
                   const ON_Line& line, 
                   double tol,
                   ON_Interval* line_parameters)
{
  double a,b,d,mn,mx,s0,s1, t0, t1;
  const double M = 1.0e308;

  // i,j,k are indices of coordinates to trim.
  // trim the direction with the biggest line deltas first
  ON_3dVector v = line.Direction();
  const int i = v.MaximumCoordinateIndex();

  // guard against ON_UNSET_VALUE as input
  if ( !(tol >= 0.0) )
    tol = 0.0;

  // clip i-th coordinate
  a = line.from[i];
  b = line.to[i];
  mn = bbox.m_min[i];
  mx = bbox.m_max[i];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( 0.0 == d )
  {
    // happens when line.from == line.to
    if ( 0.0 < mn || 0.0 > mx )
    {
      // point is in box
      if ( line_parameters )
      {
        // setting parameters makes no sense - just use 0.0
        // so it's clear we have a point
        line_parameters->Set(0.0,0.0);
      }
      return true;
    }
    return false; // point is outside box
  }
  if ( fabs(d) < 1.0 && (fabs(mn) >= fabs(d)*M || fabs(mx) >= fabs(d)*M) )
  {
    // the value of mn/d or mx/d is too large for a realistic answer to be computed
    return false;
  }
  d = 1.0/d;
  t0 = mn*d;
  t1 = mx*d;

  // set "chord" = line segment that begins and ends on the
  // i-th coordinate box side planes.
  ON_Line chord(line.PointAt(t0),line.PointAt(t1));

  // test j-th coordinate direction
  const int j = (i + (fabs(v[(i+1)%3])>fabs(v[(i+2)%3])?1:2) ) % 3;
  a = chord.from[j];
  b = chord.to[j];
  mn = bbox.m_min[j];
  mx = bbox.m_max[j];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( (0.0 < mn && d < mn) || (0.0 > mx && d > mx) )
  {
    // chord lies outside the box
    return false;
  }

  while ( fabs(d) >= 1.0 || (fabs(mn) <= fabs(d)*M && fabs(mx) <= fabs(d)*M) )
  {
    // The chord is not (nearly) parallel to the j-th sides.
    // See if the chord needs to be trimmed by the j-th sides.
    d = 1.0/d;
    s0 = mn*d;
    s1 = mx*d;
    if ( s0 > 1.0 )
    {
      if ( s1 > 1.0 )
      {
        // unstable calculation happens when
        // fabs(d) is very tiny and chord is
        // on the j-th side.
        break;
      }
      s0 = 1.0;
    }
    else if ( s0 < 0.0 )
    {
      if (s1 < 0.0)
      {
        // unstable calculation happens when
        // fabs(d) is very tiny and chord is
        // on the j-th side.
        break;
      }
      s0 = 0.0;
    }
    if ( s1 < 0.0 ) s1 = 0.0; else if ( s1 > 1.0 ) s1 = 1.0;
    d = (1.0-s0)*t0 + s0*t1;
    t1 = (1.0-s1)*t0 + s1*t1;
    t0 = d;
    v = chord.PointAt(s0);
    chord.to = chord.PointAt(s1);
    chord.from = v;
    break;
  }
  
  // test k-th coordinate direction
  const int k = (i&&j) ? 0 : ((i!=1&&j!=1)?1:2);
  a = chord.from[k];
  b = chord.to[k];
  mn = bbox.m_min[k];
  mx = bbox.m_max[k];
  if ( !(mn <= mx) )
    return false;
  mn -= (tol+a);
  mx += (tol-a);
  if ( !(mn <= mx) )
    return false;
  d = b-a;
  if ( (0.0 < mn && d < mn) || (0.0 > mx && d > mx) )
  {
    // chord does not intersect the rectangle
    return false;
  }

  if ( line_parameters )
  {

    while ( fabs(d) >= 1.0 || (fabs(mn) <= fabs(d)*M && fabs(mx) <= fabs(d)*M) )
    {
      // The chord is not (nearly) parallel to the k-th sides.
      // See if the chord needs to be trimmed by the k-th sides.
      d = 1.0/d;
      s0 = mn*d;
      s1 = mx*d;
      if ( s0 > 1.0 )
      {
        if ( s1 > 1.0 )
        {
          // unstable calculation happens when
          // fabs(d) is very tiny and chord is
          // on the k-th side.
          break;
        }
        s0 = 1.0;
      }
      else if ( s0 < 0.0 )
      {
        if (s1 < 0.0)
        {
          // unstable calculation happens when
          // fabs(d) is very tiny and chord is
          // on the k-th side.
          break;
        }
        s0 = 0.0;
      }

      if ( s1 < 0.0 ) s1 = 0.0; else if ( s1 > 1.0 ) s1 = 1.0;
      d = (1.0-s0)*t0 + s0*t1;
      t1 = (1.0-s1)*t0 + s1*t1;
      t0 = d;
      break;
    }

    if (t0 > t1 )
    {
      line_parameters->Set(t1,t0);
    }
    else
    {
      line_parameters->Set(t0,t1);
    }
  }

  return true;
}